

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *poVar2;
  int local_14;
  int gou;
  int x2;
  int x1;
  
  x2 = 0;
  std::istream::operator>>((istream *)&std::cin,&gou);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,gou);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,&local_14);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = sum(gou,local_14);
  poVar2 = std::operator<<((ostream *)&std::cout,"ans=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(){
    int x1,x2,gou;
    std::cin >> x1;
    std::cout << x1 << std::endl;

    std::cin >> x2;
    std::cout << x2 << std::endl;

    gou = sum(x1,x2);

    std::cout << "ans=" << gou << std::endl;
    return 0;
}